

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo.cpp
# Opt level: O0

void __thiscall
SBarInfoCommandFlowControl::Draw
          (SBarInfoCommandFlowControl *this,SBarInfoMainBlock *block,DSBarInfo *statusBar)

{
  bool bVar1;
  SBarInfoCommand **ppSVar2;
  SBarInfoCommand *command;
  iterator __end1;
  iterator __begin1;
  TDeletingArray<SBarInfoCommand_*,_SBarInfoCommand_*> *__range1;
  DSBarInfo *statusBar_local;
  SBarInfoMainBlock *block_local;
  SBarInfoCommandFlowControl *this_local;
  
  bVar1 = this->truth;
  __end1 = TArray<SBarInfoCommand_*,_SBarInfoCommand_*>::begin
                     (&this->commands[bVar1 & 1].super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>)
  ;
  command = (SBarInfoCommand *)
            TArray<SBarInfoCommand_*,_SBarInfoCommand_*>::end
                      (&this->commands[bVar1 & 1].super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>
                      );
  while( true ) {
    bVar1 = TIterator<SBarInfoCommand_*>::operator!=
                      (&__end1,(TIterator<SBarInfoCommand_*> *)&command);
    if (!bVar1) break;
    ppSVar2 = TIterator<SBarInfoCommand_*>::operator*(&__end1);
    (*(*ppSVar2)->_vptr_SBarInfoCommand[2])(*ppSVar2,block,statusBar);
    TIterator<SBarInfoCommand_*>::operator++(&__end1);
  }
  return;
}

Assistant:

void	Draw(const SBarInfoMainBlock *block, const DSBarInfo *statusBar)
		{
			for(auto command : commands[truth])
				command->Draw(block, statusBar);
		}